

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

void tcg_out_clz(TCGContext_conflict9 *s,int rexw,TCGReg dest,TCGReg arg1,TCGArg arg2,_Bool const_a2
                )

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  
  bVar2 = (byte)arg1;
  cVar3 = (char)dest;
  if (have_lzcnt) {
    tcg_out_opc(s,rexw + 0x201bd,dest,arg1,0);
    pbVar1 = s->code_ptr;
    s->code_ptr = pbVar1 + 1;
    *pbVar1 = (bVar2 & 7) + cVar3 * '\b' | 0xc0;
    if (!const_a2) {
      tcg_out_opc(s,rexw | 0x142,dest,(int)arg2,0);
      pbVar1 = s->code_ptr;
      s->code_ptr = pbVar1 + 1;
      *pbVar1 = (byte)arg2 & 7 | cVar3 * '\b' | 0xc0;
    }
  }
  else {
    tcg_out_opc(s,rexw + 0x1bd,dest,arg1,0);
    pbVar1 = s->code_ptr;
    s->code_ptr = pbVar1 + 1;
    *pbVar1 = (bVar2 & 7) + cVar3 * '\b' | 0xc0;
    tgen_arithi(s,rexw + 6,dest,(ulong)(rexw != 0) << 5 | 0x1f,0);
    tcg_out_opc(s,rexw + 0x85,arg1,arg1,0);
    pbVar1 = s->code_ptr;
    s->code_ptr = pbVar1 + 1;
    *pbVar1 = (bVar2 & 7) + bVar2 * '\b' | 0xc0;
    tcg_out_opc(s,rexw | 0x144,dest,(int)arg2,0);
    pbVar1 = s->code_ptr;
    s->code_ptr = pbVar1 + 1;
    *pbVar1 = ((byte)arg2 & 7) + cVar3 * '\b' | 0xc0;
  }
  return;
}

Assistant:

static void tcg_out_clz(TCGContext *s, int rexw, TCGReg dest, TCGReg arg1,
                        TCGArg arg2, bool const_a2)
{
    if (have_lzcnt) {
        tcg_out_modrm(s, OPC_LZCNT + rexw, dest, arg1);
        if (const_a2) {
            tcg_debug_assert(arg2 == (rexw ? 64 : 32));
        } else {
            tcg_debug_assert(dest != arg2);
            tcg_out_cmov(s, TCG_COND_LTU, rexw, dest, arg2);
        }
    } else {
        tcg_debug_assert(!const_a2);
        tcg_debug_assert(dest != arg1);
        tcg_debug_assert(dest != arg2);

        /* Recall that the output of BSR is the index not the count.  */
        tcg_out_modrm(s, OPC_BSR + rexw, dest, arg1);
        tgen_arithi(s, ARITH_XOR + rexw, dest, rexw ? 63 : 31, 0);

        /* Since we have destroyed the flags from BSR, we have to re-test.  */
        tcg_out_cmp(s, arg1, 0, 1, rexw);
        tcg_out_cmov(s, TCG_COND_EQ, rexw, dest, arg2);
    }
}